

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O3

void __thiscall amrex::MLABecLaplacian::update_singular_flags(MLABecLaplacian *this)

{
  pointer piVar1;
  uint uVar2;
  pointer paVar3;
  pointer paVar4;
  int alev;
  long lVar5;
  long lVar6;
  Real RVar7;
  value_type_conflict local_4c;
  double local_48;
  
  piVar1 = (this->m_is_singular).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_is_singular).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar1) {
    (this->m_is_singular).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar1
    ;
  }
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_is_singular).super_vector<int,_std::allocator<int>_>,
             (long)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels,
             &local_4c);
  paVar3 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar3 = (pointer)std::
                    __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                              (paVar3,paVar3 + 1);
  paVar4 = (pointer)std::
                    __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                              ();
  if (((paVar3 == (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_lobc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1) &&
      (paVar4 == (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_hibc.
                 super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                 .
                 super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1)) &&
     (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      if (((this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_domain_covered.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar5] != 0) &&
         (**(long **)((long)&(((this->super_MLCellABecLap).m_overset_mask.
                               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                             ).
                             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     + lVar6) == 0)) {
        uVar2 = 1;
        if ((this->m_a_scalar != 0.0) || (NAN(this->m_a_scalar))) {
          local_48 = MultiFab::sum((MultiFab *)
                                   (*(long *)((long)&(((this->m_a_coeffs).
                                                                                                              
                                                  super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                                  ).
                                                  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                             + lVar6 + 8) + -0x180),0,false);
          RVar7 = MultiFab::norm0((MultiFab *)
                                  (*(long *)((long)&(((this->m_a_coeffs).
                                                                                                            
                                                  super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                                  ).
                                                  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                            + lVar6 + 8) + -0x180),0,0,false,false);
          uVar2 = (uint)(ABS(local_48) <= RVar7 * 1e-12);
        }
        (this->m_is_singular).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar5] = uVar2;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x18;
    } while (lVar5 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLABecLaplacian::update_singular_flags ()
{
    m_is_singular.clear();
    m_is_singular.resize(m_num_amr_levels, false);
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end())
    {  // No Dirichlet
        for (int alev = 0; alev < m_num_amr_levels; ++alev)
        {
            // For now this assumes that overset regions are treated as Dirichlet bc's
            if (m_domain_covered[alev] && !m_overset_mask[alev][0])
            {
                if (m_a_scalar == 0.0)
                {
                    m_is_singular[alev] = true;
                }
                else
                {
                    Real asum = m_a_coeffs[alev].back().sum();
                    Real amax = m_a_coeffs[alev].back().norm0();
                    m_is_singular[alev] = (std::abs(asum) <= amax * 1.e-12);
                }
            }
        }
    }
}